

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buddy_allocator.h
# Opt level: O0

void __thiscall cppcms::impl::buddy_allocator::test_free(buddy_allocator *this)

{
  page *ppVar1;
  ostream *poVar2;
  runtime_error *prVar3;
  char *pcVar4;
  buddy_allocator *in_RDI;
  ostringstream oss_3;
  ostringstream oss_2;
  ostringstream oss_1;
  ostringstream oss;
  int i;
  char *p;
  string local_6a0 [32];
  ostringstream local_680 [383];
  undefined1 local_501;
  string local_500 [32];
  ostringstream local_4e0 [383];
  undefined1 local_361;
  string local_360 [32];
  ostringstream local_340 [383];
  undefined1 local_1c1;
  string local_1c0 [48];
  ostringstream local_190 [380];
  int local_14;
  page *local_10;
  
  local_10 = (page *)memory(in_RDI);
  local_14 = in_RDI->max_bit_size_;
  do {
    ppVar1 = local_10;
    if (local_14 < 0) {
      pcVar4 = memory(in_RDI);
      if ((page *)(pcVar4 + in_RDI->memory_size_) < ppVar1) {
        std::__cxx11::ostringstream::ostringstream(local_4e0);
        poVar2 = std::operator<<((ostream *)local_4e0,"Error ");
        poVar2 = std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/buddy_allocator.h"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x7c);
        std::operator<<(poVar2," p<= memory() + memory_size_");
        local_501 = 1;
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar3,local_500);
        local_501 = 0;
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pcVar4 = memory(in_RDI);
      if ((long)(pcVar4 + (in_RDI->memory_size_ - (long)local_10)) < 0x20) {
        return;
      }
      std::__cxx11::ostringstream::ostringstream(local_680);
      poVar2 = std::operator<<((ostream *)local_680,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/buddy_allocator.h"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x7d);
      std::operator<<(poVar2," memory() + memory_size_ - p < int(alignment * 2)");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_6a0);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (in_RDI->free_list_[local_14] != (page *)0x0) {
      if (in_RDI->free_list_[local_14] != local_10) {
        std::__cxx11::ostringstream::ostringstream(local_190);
        poVar2 = std::operator<<((ostream *)local_190,"Error ");
        poVar2 = std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/buddy_allocator.h"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x77);
        std::operator<<(poVar2," (char*)free_list_[i]==p");
        local_1c1 = 1;
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar3,local_1c0);
        local_1c1 = 0;
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (in_RDI->free_list_[local_14]->bits != local_14) {
        std::__cxx11::ostringstream::ostringstream(local_340);
        poVar2 = std::operator<<((ostream *)local_340,"Error ");
        poVar2 = std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/buddy_allocator.h"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x78);
        std::operator<<(poVar2," free_list_[i]->bits == i");
        local_361 = 1;
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar3,local_360);
        local_361 = 0;
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_10 = (page *)((long)&local_10->bits +
                         (1L << ((byte)in_RDI->free_list_[local_14]->bits & 0x3f)));
    }
    local_14 = local_14 + -1;
  } while( true );
}

Assistant:

void test_free() {
		char *p=memory();
		for(int i=max_bit_size_;i>=0;i--) {
			if(free_list_[i]) {
				TEST((char*)free_list_[i]==p);
				TEST(free_list_[i]->bits == i);
				p += 1ul << free_list_[i]->bits;
			}
		}
		TEST(p<= memory() + memory_size_);
		TEST(memory() + memory_size_ - p < int(alignment * 2));
	}